

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineClearUtil.cpp
# Opt level: O0

IVec4 __thiscall vkt::pipeline::defaultClearColorInt(pipeline *this,TextureFormat *format)

{
  undefined8 extraout_RDX;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  IVec4 IVar5;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  undefined1 local_68 [8];
  Vec4 color;
  TextureFormatInfo formatInfo;
  TextureFormat *format_local;
  IVec4 *result;
  
  formatInfo.lookupBias.m_data._8_8_ = format;
  tcu::getTextureFormatInfo((TextureFormatInfo *)(color.m_data + 2),format);
  defaultClearColorUnorm();
  tcu::operator-((tcu *)&local_78,&local_88,(Vector<float,_4> *)(formatInfo.lookupScale.m_data + 2))
  ;
  tcu::operator/((tcu *)local_68,&local_78,(Vector<float,_4> *)(formatInfo.valueMax.m_data + 2));
  fVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_68);
  fVar1 = deFloatRound(fVar1);
  fVar2 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_68);
  fVar2 = deFloatRound(fVar2);
  fVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_68);
  fVar3 = deFloatRound(fVar3);
  fVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_68);
  fVar4 = deFloatRound(fVar4);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this,(int)fVar1,(int)fVar2,(int)fVar3,(int)fVar4);
  IVar5.m_data[2] = (int)extraout_RDX;
  IVar5.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar5.m_data._0_8_ = this;
  return (IVec4)IVar5.m_data;
}

Assistant:

tcu::IVec4 defaultClearColorInt (const tcu::TextureFormat& format)
{
	const tcu::TextureFormatInfo	formatInfo	= tcu::getTextureFormatInfo(format);
	const tcu::Vec4					color		= (defaultClearColorUnorm() - formatInfo.lookupBias) / formatInfo.lookupScale;

	const tcu::IVec4				result		((deInt32)deFloatRound(color.x()), (deInt32)deFloatRound(color.y()),
												 (deInt32)deFloatRound(color.z()), (deInt32)deFloatRound(color.w()));

	return result;
}